

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestPageControl::testBusy(TestPageControl *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QColor *pQVar5;
  QPoint pos;
  qsizetype qVar6;
  QRect local_15c;
  QPoint local_14c;
  KeyboardModifiers local_144;
  code *local_140;
  undefined8 local_138;
  undefined1 local_130 [8];
  QSignalSpy spy;
  KeyboardModifiers local_98;
  QColor local_94;
  QColor local_84;
  QColor local_74;
  QColor local_64;
  int local_54;
  undefined4 local_50;
  int count;
  undefined1 local_40 [8];
  PageControl p;
  TestPageControl *this_local;
  
  p.d.d = (PageControlPrivate *)this;
  QtMWidgets::PageControl::PageControl((PageControl *)local_40,(QWidget *)0x0);
  QWidget::resize((QWidget *)local_40,this->m_btnSize * 3,this->m_btnSize << 2);
  QWidget::show();
  bVar1 = QTest::qWaitForWindowActive((QWidget *)local_40,5000);
  bVar1 = QTest::qVerify((bool)(bVar1 & 1),"QTest::qWaitForWindowActive( &p )","",
                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                         ,0x24);
  if ((bVar1 & 1) == 0) {
    local_50 = 1;
  }
  else {
    local_54 = QWidget::width((QWidget *)local_40);
    local_54 = local_54 / this->m_btnSize;
    QColor::QColor(&local_64,red);
    QtMWidgets::PageControl::setPageIndicatorColor((PageControl *)local_40,&local_64);
    QColor::QColor(&local_74,red);
    QtMWidgets::PageControl::setCurrentPageIndicatorColor((PageControl *)local_40,&local_74);
    pQVar5 = QtMWidgets::PageControl::pageIndicatorColor((PageControl *)local_40);
    QColor::QColor(&local_84,red);
    bVar2 = (bool)QColor::operator==(pQVar5,(QColor *)&local_84);
    bVar1 = QTest::qVerify(bVar2,"p.pageIndicatorColor() == Qt::red","",
                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                           ,0x2b);
    if (((bVar1 ^ 0xff) & 1) == 0) {
      pQVar5 = QtMWidgets::PageControl::currentPageIndicatorColor((PageControl *)local_40);
      QColor::QColor(&local_94,red);
      bVar2 = (bool)QColor::operator==(pQVar5,(QColor *)&local_94);
      bVar1 = QTest::qVerify(bVar2,"p.currentPageIndicatorColor() == Qt::red","",
                             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                             ,0x2c);
      if (((bVar1 ^ 0xff) & 1) == 0) {
        QtMWidgets::PageControl::setCount((PageControl *)local_40,10);
        QtMWidgets::PageControl::setCurrentIndex((PageControl *)local_40,4);
        iVar3 = QtMWidgets::PageControl::count((PageControl *)local_40);
        bVar1 = QTest::qVerify(iVar3 == 10,"p.count() == 10","",
                               "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                               ,0x32);
        if ((bVar1 & 1) == 0) {
          local_50 = 1;
        }
        else {
          iVar3 = QtMWidgets::PageControl::currentIndex((PageControl *)local_40);
          bVar1 = QTest::qVerify(iVar3 == 4,"p.currentIndex() == 4","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                                 ,0x33);
          if ((bVar1 & 1) == 0) {
            local_50 = 1;
          }
          else {
            QFlags<Qt::KeyboardModifier>::QFlags(&local_98);
            iVar4 = QWidget::width((QWidget *)local_40);
            iVar3 = this->m_btnSize;
            QRect::QRect((QRect *)&spy.m_waiting,(iVar4 - iVar3 * local_54) / 2,0,iVar3,iVar3);
            pos = QRect::center((QRect *)&spy.m_waiting);
            QTest::mouseClick((QWidget *)local_40,LeftButton,local_98,pos,0x14);
            QTest::qWait(0x32);
            iVar3 = QtMWidgets::PageControl::currentIndex((PageControl *)local_40);
            bVar1 = QTest::qVerify(iVar3 == 0,"p.currentIndex() == 0","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                                   ,0x3b);
            if ((bVar1 & 1) == 0) {
              local_50 = 1;
            }
            else {
              QWidget::resize((QWidget *)local_40,this->m_btnSize * 10,this->m_btnSize * 2);
              QTest::qWait(0x32);
              local_54 = QWidget::width((QWidget *)local_40);
              local_54 = local_54 / this->m_btnSize;
              local_140 = QtMWidgets::PageControl::currentChanged;
              local_138 = 0;
              QSignalSpy::QSignalSpy<void(QtMWidgets::PageControl::*)(int,int)>
                        ((QSignalSpy *)local_130,(Object *)local_40,0x1a51c0);
              QFlags<Qt::KeyboardModifier>::QFlags(&local_144);
              iVar4 = QWidget::width((QWidget *)local_40);
              iVar3 = this->m_btnSize;
              QRect::QRect(&local_15c,(iVar4 - iVar3 * local_54) / 2 + iVar3 * 4,0,iVar3,iVar3);
              local_14c = QRect::center(&local_15c);
              QTest::mouseClick((QWidget *)local_40,LeftButton,local_144,local_14c,0x14);
              QTest::qWait(0x32);
              iVar3 = QtMWidgets::PageControl::currentIndex((PageControl *)local_40);
              bVar1 = QTest::qVerify(iVar3 == 4,"p.currentIndex() == 4","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                                     ,0x4b);
              if ((bVar1 & 1) == 0) {
                local_50 = 1;
              }
              else {
                qVar6 = QList<QList<QVariant>_>::count((QList<QList<QVariant>_> *)&spy.field_0x8);
                bVar1 = QTest::qVerify(qVar6 == 1,"spy.count() == 1","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                                       ,0x4c);
                if ((bVar1 & 1) == 0) {
                  local_50 = 1;
                }
                else {
                  local_50 = 0;
                }
              }
              QSignalSpy::~QSignalSpy((QSignalSpy *)local_130);
            }
          }
        }
      }
      else {
        local_50 = 1;
      }
    }
    else {
      local_50 = 1;
    }
  }
  QtMWidgets::PageControl::~PageControl((PageControl *)local_40);
  return;
}

Assistant:

void testBusy()
	{
		QtMWidgets::PageControl p;

		p.resize( m_btnSize * 3, m_btnSize * 4 );
		p.show();

		QVERIFY( QTest::qWaitForWindowActive( &p ) );

		int count = p.width() / m_btnSize;

		p.setPageIndicatorColor( Qt::red );
		p.setCurrentPageIndicatorColor( Qt::red );

		QVERIFY( p.pageIndicatorColor() == Qt::red );
		QVERIFY( p.currentPageIndicatorColor() == Qt::red );

		p.setCount( 10 );

		p.setCurrentIndex( 4 );

		QVERIFY( p.count() == 10 );
		QVERIFY( p.currentIndex() == 4 );

		QTest::mouseClick( &p, Qt::LeftButton, {},
			QRect( ( p.width() - m_btnSize * count ) / 2, 0, m_btnSize, m_btnSize ).center(),
			20 );

		QTest::qWait( 50 );

		QVERIFY( p.currentIndex() == 0 );

		p.resize( m_btnSize * 10, m_btnSize * 2 );

		QTest::qWait( 50 );

		count = p.width() / m_btnSize;

		QSignalSpy spy( &p, &QtMWidgets::PageControl::currentChanged );

		QTest::mouseClick( &p, Qt::LeftButton, {},
			QRect( ( p.width() - m_btnSize * count ) / 2 + m_btnSize * 4, 0,
				m_btnSize, m_btnSize ).center(), 20 );

		QTest::qWait( 50 );

		QVERIFY( p.currentIndex() == 4 );
		QVERIFY( spy.count() == 1 );
	}